

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsDrawTest.cpp
# Opt level: O0

char * deqp::gls::anon_unknown_1::RandomArrayGenerator::generatePackedArray
                 (int seed,int elementCount,int componentCount,int offset,int stride)

{
  deUint32 dVar1;
  deUint32 dVar2;
  deUint32 dVar3;
  deUint32 dVar4;
  char *pcVar5;
  deUint32 packedValue;
  deUint32 w;
  deUint32 z;
  deUint32 y;
  deUint32 x;
  int vertexNdx;
  deRandom rnd;
  char *writePtr;
  char *data;
  size_t bufferSize;
  size_t elementSize;
  deUint32 limit2;
  deUint32 limit10;
  int stride_local;
  int offset_local;
  int componentCount_local;
  int elementCount_local;
  int seed_local;
  
  pcVar5 = (char *)operator_new__((long)(offset + (elementCount + -1) * stride) + 4);
  rnd._8_8_ = pcVar5 + offset;
  deRandom_init((deRandom *)&x,seed);
  for (y = 0; (int)y < elementCount; y = y + 1) {
    dVar1 = deRandom_getUint32((deRandom *)&x);
    dVar2 = deRandom_getUint32((deRandom *)&x);
    dVar3 = deRandom_getUint32((deRandom *)&x);
    dVar4 = deRandom_getUint32((deRandom *)&x);
    alignmentSafeAssignment<unsigned_int>
              ((char *)rnd._8_8_,
               dVar4 << 0x1e | (dVar3 & 0x3ff) << 0x14 | (dVar2 & 0x3ff) << 10 | dVar1 & 0x3ff);
    rnd._8_8_ = rnd._8_8_ + (long)stride;
  }
  return pcVar5;
}

Assistant:

char* RandomArrayGenerator::generatePackedArray (int seed, int elementCount, int componentCount, int offset, int stride)
{
	DE_ASSERT(componentCount == 4);
	DE_UNREF(componentCount);

	const deUint32 limit10		= (1 << 10);
	const deUint32 limit2		= (1 << 2);
	const size_t elementSize	= 4;
	const size_t bufferSize		= offset + (elementCount - 1) * stride + elementSize;

	char* data = new char[bufferSize];
	char* writePtr = data + offset;

	deRandom rnd;
	deRandom_init(&rnd, seed);

	for (int vertexNdx = 0; vertexNdx < elementCount; vertexNdx++)
	{
		const deUint32 x			= deRandom_getUint32(&rnd) % limit10;
		const deUint32 y			= deRandom_getUint32(&rnd) % limit10;
		const deUint32 z			= deRandom_getUint32(&rnd) % limit10;
		const deUint32 w			= deRandom_getUint32(&rnd) % limit2;
		const deUint32 packedValue	= (w << 30) | (z << 20) | (y << 10) | (x);

		alignmentSafeAssignment(writePtr, packedValue);
		writePtr += stride;
	}

	return data;
}